

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceManager::selectedPreCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  Snapshot *this_00;
  ForceDecomposition *pFVar1;
  Atom *pAVar2;
  RigidBody *pRVar3;
  CutoffGroup *pCVar4;
  pointer ppAVar5;
  pointer ppRVar6;
  pointer ppCVar7;
  potVec zeroPot;
  double local_148;
  Vector<double,_3U> local_140;
  Vector<double,_3U> local_128;
  Vector<double,_7U> local_110;
  Vector<double,_7U> local_d8;
  Vector<double,_7U> local_a0;
  Vector<double,_7U> local_68;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::setBondPotential(this_00,0.0);
  Snapshot::setBendPotential(this_00,0.0);
  Snapshot::setTorsionPotential(this_00,0.0);
  Snapshot::setInversionPotential(this_00,0.0);
  local_140.data_[0] = 0.0;
  Vector<double,_7U>::Vector(&local_110,local_140.data_);
  Vector<double,_7U>::Vector(&local_68,&local_110);
  Snapshot::setLongRangePotentials(this_00,&local_68);
  Vector<double,_7U>::Vector(&local_a0,&local_110);
  Snapshot::setExcludedPotentials(this_00,&local_a0);
  if (this->doPotentialSelection_ == true) {
    Vector<double,_7U>::Vector(&local_d8,&local_110);
    Snapshot::setSelectionPotentials(this_00,&local_d8);
  }
  Snapshot::setRestraintPotential(this_00,0.0);
  Snapshot::setRawPotential(this_00,0.0);
  ppAVar5 = (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar5 !=
      (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001d98ff;
  pAVar2 = (Atom *)0x0;
  while (pAVar2 != (Atom *)0x0) {
    StuntDouble::zeroForcesAndTorques(&pAVar2->super_StuntDouble);
    ppAVar5 = ppAVar5 + 1;
    pAVar2 = (Atom *)0x0;
    if (ppAVar5 !=
        (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001d98ff:
      pAVar2 = *ppAVar5;
    }
  }
  ppRVar6 = (mol1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar6 !=
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001d9932;
  pRVar3 = (RigidBody *)0x0;
  while (pRVar3 != (RigidBody *)0x0) {
    StuntDouble::zeroForcesAndTorques(&pRVar3->super_StuntDouble);
    ppRVar6 = ppRVar6 + 1;
    pRVar3 = (RigidBody *)0x0;
    if (ppRVar6 !=
        (mol1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001d9932:
      pRVar3 = *ppRVar6;
    }
  }
  if (this->info_->nGlobalCutoffGroups_ != this->info_->nGlobalAtoms_) {
    ppCVar7 = (mol1->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar7 !=
        (mol1->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001d9982;
    pCVar4 = (CutoffGroup *)0x0;
    while (pCVar4 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(pCVar4);
      ppCVar7 = ppCVar7 + 1;
      pCVar4 = (CutoffGroup *)0x0;
      if (ppCVar7 !=
          (mol1->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001d9982:
        pCVar4 = *ppCVar7;
      }
    }
  }
  ppAVar5 = (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar5 !=
      (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001d99a4;
  pAVar2 = (Atom *)0x0;
  while (pAVar2 != (Atom *)0x0) {
    StuntDouble::zeroForcesAndTorques(&pAVar2->super_StuntDouble);
    ppAVar5 = ppAVar5 + 1;
    pAVar2 = (Atom *)0x0;
    if (ppAVar5 !=
        (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001d99a4:
      pAVar2 = *ppAVar5;
    }
  }
  ppRVar6 = (mol2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar6 !=
      (mol2->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001d99d6;
  pRVar3 = (RigidBody *)0x0;
  while (pRVar3 != (RigidBody *)0x0) {
    StuntDouble::zeroForcesAndTorques(&pRVar3->super_StuntDouble);
    ppRVar6 = ppRVar6 + 1;
    pRVar3 = (RigidBody *)0x0;
    if (ppRVar6 !=
        (mol2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001d99d6:
      pRVar3 = *ppRVar6;
    }
  }
  if (this->info_->nGlobalCutoffGroups_ != this->info_->nGlobalAtoms_) {
    ppCVar7 = (mol2->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar7 !=
        (mol2->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001d9a6f;
    pCVar4 = (CutoffGroup *)0x0;
    while (pCVar4 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(pCVar4);
      ppCVar7 = ppCVar7 + 1;
      pCVar4 = (CutoffGroup *)0x0;
      if (ppCVar7 !=
          (mol2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001d9a6f:
        pCVar4 = *ppCVar7;
      }
    }
  }
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->virialTensor,0.0);
  pFVar1 = this->fDecomp_;
  local_148 = 0.0;
  Vector<double,_3U>::Vector(&local_140,&local_148);
  Vector<double,_3U>::Vector(&local_128,&local_140);
  (*pFVar1->_vptr_ForceDecomposition[0x2e])(pFVar1,&local_128);
  return;
}

Assistant:

void ForceManager::selectedPreCalculation(Molecule* mol1, Molecule* mol2) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);
    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    // First we zero out for mol1
    for (atom = mol1->beginAtom(ai); atom != NULL; atom = mol1->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol1->beginCutoffGroup(ci); cg != NULL;
           cg = mol1->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Next we zero out for mol2
    for (atom = mol2->beginAtom(ai); atom != NULL; atom = mol2->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol2->beginCutoffGroup(ci); cg != NULL;
           cg = mol2->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));
  }